

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

size_t json_array_get_string_len(JSON_Array *array,size_t index)

{
  JSON_Value *pJVar1;
  
  if ((array == (JSON_Array *)0x0) || (array->count <= index)) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    pJVar1 = array->items[index];
  }
  if ((pJVar1 != (JSON_Value *)0x0) && (pJVar1->type == 2)) {
    return (pJVar1->value).string.length;
  }
  return 0;
}

Assistant:

JSON_Value * json_array_get_value(const JSON_Array *array, size_t index) {
    if (array == NULL || index >= json_array_get_count(array)) {
        return NULL;
    }
    return array->items[index];
}